

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O2

int beagleRemoveScaleFactors(int instance,int *scalingIndices,int count,int cumulativeScalingIndex)

{
  int iVar1;
  BeagleImpl *pBVar2;
  
  pBVar2 = beagle::getBeagleInstance(instance);
  if (pBVar2 != (BeagleImpl *)0x0) {
    iVar1 = (**(code **)(*(long *)pBVar2 + 0x110))
                      (pBVar2,scalingIndices,count,cumulativeScalingIndex,
                       *(code **)(*(long *)pBVar2 + 0x110));
    return iVar1;
  }
  return -4;
}

Assistant:

int beagleRemoveScaleFactors(int instance,
                           const int* scalingIndices,
                           int count,
                           int cumulativeScalingIndex) {
    DEBUG_START_TIME();
//    try {
        beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
        if (beagleInstance == NULL)
            return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
        int returnValue = beagleInstance->removeScaleFactors(scalingIndices, count, cumulativeScalingIndex);
        DEBUG_END_TIME();
        return returnValue;
//    }
//    catch (std::bad_alloc &) {
//        return BEAGLE_ERROR_OUT_OF_MEMORY;
//    }
//    catch (std::out_of_range &) {
//        return BEAGLE_ERROR_OUT_OF_RANGE;
//    }
//    catch (...) {
//        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
//    }
}